

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::MID(Parser *this)

{
  lex_t type_par;
  Lex local_24;
  
  HIGH(this);
  type_par = this->c_type;
  if (((ulong)type_par < 0x23) && ((0x70c400000U >> ((ulong)type_par & 0x3f) & 1) != 0)) {
    Lex::Lex(&local_24,type_par,0,0);
    std::deque<Lex,_std::allocator<Lex>_>::emplace_back<Lex>(&(this->lex_stack).c,&local_24);
    Lex::~Lex(&local_24);
    get_lex(this);
    HIGH(this);
    check_op(this);
  }
  return;
}

Assistant:

void Parser::MID(){
    HIGH();
    if (c_type == LEX_EQ || c_type == LEX_LSS || c_type == LEX_GTR ||
         c_type == LEX_LEQ || c_type == LEX_GEQ || c_type == LEX_NEQ)
    {
        lex_stack.push (c_type);
        get_lex();
        HIGH();
        check_op();
    }
}